

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlXPathCompExprPtr xmlXPathNewCompExpr(void)

{
  xmlXPathCompExprPtr pxVar1;
  xmlXPathStepOp *__s;
  
  pxVar1 = (xmlXPathCompExprPtr)(*xmlMalloc)(0x30);
  if (pxVar1 == (xmlXPathCompExprPtr)0x0) {
    pxVar1 = (xmlXPathCompExprPtr)0x0;
    xmlXPathErrMemory((xmlXPathContextPtr)0x0,"allocating component\n");
  }
  else {
    pxVar1->expr = (xmlChar *)0x0;
    pxVar1->dict = (xmlDictPtr)0x0;
    pxVar1->steps = (xmlXPathStepOp *)0x0;
    *(undefined8 *)&pxVar1->last = 0;
    pxVar1->stream = (xmlPatternPtr)0x0;
    pxVar1->nbStep = 0;
    pxVar1->maxStep = 10;
    __s = (xmlXPathStepOp *)(*xmlMalloc)(0x230);
    pxVar1->steps = __s;
    if (__s == (xmlXPathStepOp *)0x0) {
      xmlXPathErrMemory((xmlXPathContextPtr)0x0,"allocating steps\n");
      (*xmlFree)(pxVar1);
      pxVar1 = (xmlXPathCompExprPtr)0x0;
    }
    else {
      memset(__s,0,(long)pxVar1->maxStep * 0x38);
      pxVar1->last = -1;
    }
  }
  return pxVar1;
}

Assistant:

static xmlXPathCompExprPtr
xmlXPathNewCompExpr(void) {
    xmlXPathCompExprPtr cur;

    cur = (xmlXPathCompExprPtr) xmlMalloc(sizeof(xmlXPathCompExpr));
    if (cur == NULL) {
        xmlXPathErrMemory(NULL, "allocating component\n");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlXPathCompExpr));
    cur->maxStep = 10;
    cur->nbStep = 0;
    cur->steps = (xmlXPathStepOp *) xmlMalloc(cur->maxStep *
	                                   sizeof(xmlXPathStepOp));
    if (cur->steps == NULL) {
        xmlXPathErrMemory(NULL, "allocating steps\n");
	xmlFree(cur);
	return(NULL);
    }
    memset(cur->steps, 0, cur->maxStep * sizeof(xmlXPathStepOp));
    cur->last = -1;
#ifdef DEBUG_EVAL_COUNTS
    cur->nb = 0;
#endif
    return(cur);
}